

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

uint64_t __thiscall roaring::Roaring64Map::minimum(Roaring64Map *this)

{
  _Rb_tree_color _Var1;
  _Bool _Var2;
  uint32_t uVar3;
  _Rb_tree_node_base *p_Var4;
  
  p_Var4 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(this->roarings)._M_t._M_impl.super__Rb_tree_header) {
      return 0xffffffffffffffff;
    }
    _Var2 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var4[1]._M_parent);
    if (!_Var2) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  _Var1 = p_Var4[1]._M_color;
  uVar3 = roaring_bitmap_minimum((roaring_bitmap_t *)&p_Var4[1]._M_parent);
  return CONCAT44(_Var1,uVar3);
}

Assistant:

uint64_t minimum() const {
        for (auto roaring_iter = roarings.cbegin();
             roaring_iter != roarings.cend(); ++roaring_iter) {
            if (!roaring_iter->second.isEmpty()) {
                return uniteBytes(roaring_iter->first,
                                  roaring_iter->second.minimum());
            }
        }
        // we put std::numeric_limits<>::max/min in parentheses
        // to avoid a clash with the Windows.h header under Windows
        return (std::numeric_limits<uint64_t>::max)();
    }